

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsv.hpp
# Opt level: O0

void remora::bindings::
     trsv_impl<false,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *param_2)

{
  reference pvVar1;
  double *pdVar2;
  invalid_argument *this;
  value_type value;
  size_t n;
  size_t size;
  matrix_element<const_double,_remora::row_major> A_elem;
  double in_stack_ffffffffffffff48;
  vector<double,_remora::cpu_tag> *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff80;
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  double local_40;
  ulong local_38;
  ulong local_30;
  dense_matrix_storage<const_double,_remora::dense_tag> local_28;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *local_18;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>::
  operator()(param_1);
  local_28 = (dense_matrix_storage<const_double,_remora::dense_tag>)
             matrix<double,_remora::row_major,_remora::cpu_tag>::elements(in_stack_ffffffffffffff70)
  ;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>::operator()(local_18);
  local_30 = vector<double,_remora::cpu_tag>::size((vector<double,_remora::cpu_tag> *)0x1343c7);
  local_38 = 0;
  while( true ) {
    if (local_30 <= local_38) {
      return;
    }
    subrange<remora::vector<double,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70
              );
    row<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              ((matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    subrange<remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
               (size_t)in_stack_ffffffffffffff50);
    dot<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,double>
              (local_58,local_70,&local_40);
    in_stack_ffffffffffffff58 = local_40;
    vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>::operator()
              (local_18);
    pvVar1 = vector<double,_remora::cpu_tag>::operator()
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    *pvVar1 = *pvVar1 - in_stack_ffffffffffffff58;
    pdVar2 = device_traits<remora::cpu_tag>::matrix_element<const_double,_remora::row_major>::
             operator()((matrix_element<const_double,_remora::row_major> *)in_stack_ffffffffffffff70
                        ,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) break;
    pdVar2 = device_traits<remora::cpu_tag>::matrix_element<const_double,_remora::row_major>::
             operator()((matrix_element<const_double,_remora::row_major> *)in_stack_ffffffffffffff70
                        ,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff48 = *pdVar2;
    vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>::operator()
              (local_18);
    pvVar1 = vector<double,_remora::cpu_tag>::operator()
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    *pvVar1 = *pvVar1 / in_stack_ffffffffffffff48;
    local_38 = local_38 + 1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"[TRSV] Matrix is singular!");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void trsv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> &b,
	lower, row_major, left
) {
	REMORA_SIZE_CHECK(A().size1() == A().size2());
	REMORA_SIZE_CHECK(A().size2() == b().size());

	typedef typename V::value_type value_type;
	auto A_elem = A().elements();
	std::size_t size = b().size();
	for (std::size_t n = 0; n < size; ++ n) {
		value_type value;
		bindings::dot(
			subrange(b,0,n), subrange(row(A,n),0,n), value, 
			typename MatA::evaluation_category::tag(),
			typename V::evaluation_category::tag()
		);
		b()(n) -= value;
		if(!Unit){
			if(A_elem(n, n) == value_type()){//matrix is singular
				throw std::invalid_argument("[TRSV] Matrix is singular!");
			}
			b()(n) /= A_elem(n, n);
		}
	}
}